

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagesetupdialog_unix.cpp
# Opt level: O0

void __thiscall QPagePreview::paintEvent(QPagePreview *this,QPaintEvent *param_2)

{
  QLatin1StringView latin1;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  QColor *pQVar9;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QPainter *this_00;
  double dVar10;
  int y;
  int x;
  int textHeight;
  int textWidth;
  int spacing;
  int i_1;
  int i;
  int bottom;
  int right;
  int top;
  int left;
  qreal height_factor;
  qreal width_factor;
  QRect textRect;
  QString text;
  QRect offset;
  QPainter p;
  QRect marginRect;
  QMarginsF margins;
  QRect pageRect;
  QSizeF scaledSize;
  QSize pageSize;
  QFont font;
  QColor shadow;
  int in_stack_fffffffffffffe48;
  ColorRole in_stack_fffffffffffffe4c;
  AlignmentFlag in_stack_fffffffffffffe50;
  TextFlag in_stack_fffffffffffffe54;
  int in_stack_fffffffffffffe58;
  AspectRatioMode in_stack_fffffffffffffe5c;
  int in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  QRect *in_stack_fffffffffffffe68;
  QRect *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe78;
  int local_170;
  int local_16c;
  int local_15c;
  int local_144;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  QBrush local_e8 [8];
  QPen local_e0 [8];
  QRect local_d8;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  QMarginsF local_b0;
  QRect local_90;
  QPoint local_80;
  QSize local_78;
  undefined8 local_68;
  undefined8 local_60;
  QSize local_58;
  QSizeF local_50;
  undefined1 local_40 [16];
  QSize local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.wd.m_i = -0x55555556;
  local_30.ht.m_i = -0x55555556;
  local_40 = QPageLayout::fullRectPoints();
  local_30 = QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  local_50.wd = -NAN;
  local_50.ht = -NAN;
  iVar2 = QWidget::width((QWidget *)0x16adce);
  iVar2 = iVar2 + -10;
  QWidget::height((QWidget *)0x16addf);
  local_58 = QSize::scaled((QSize *)in_stack_fffffffffffffe68,iVar2,in_stack_fffffffffffffe60,
                           in_stack_fffffffffffffe5c);
  QSizeF::QSizeF((QSizeF *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (QSize *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  local_68 = 0xaaaaaaaaaaaaaaaa;
  local_60 = 0xaaaaaaaaaaaaaaaa;
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
  local_78 = QSizeF::toSize((QSizeF *)CONCAT44(iVar2,in_stack_fffffffffffffe60));
  QRect::QRect(in_stack_fffffffffffffe70,(QPoint *)in_stack_fffffffffffffe68,
               (QSize *)CONCAT44(iVar2,in_stack_fffffffffffffe60));
  local_90 = QWidget::rect((QWidget *)in_stack_fffffffffffffe68);
  local_80 = QRect::center(in_stack_fffffffffffffe70);
  QRect::moveCenter(in_stack_fffffffffffffe68,(QPoint *)CONCAT44(iVar2,in_stack_fffffffffffffe60));
  this_00 = (QPainter *)QSizeF::width(&local_50);
  QSize::width((QSize *)0x16aedc);
  QSizeF::height(&local_50);
  QSize::height((QSize *)0x16af13);
  local_b0.m_left = -NAN;
  local_b0.m_top = -NAN;
  local_b0.m_right = -NAN;
  local_b0.m_bottom = -NAN;
  QPageLayout::margins((Unit)&local_b0);
  QMarginsF::left(&local_b0);
  iVar3 = qRound(7.34551110823182e-318);
  QMarginsF::top(&local_b0);
  iVar4 = qRound(7.3456790905514e-318);
  QMarginsF::right(&local_b0);
  iVar5 = qRound(7.34584707287099e-318);
  QMarginsF::bottom(&local_b0);
  qRound(7.3460002332212e-318);
  local_c0 = 0xaaaaaaaaaaaaaaaa;
  local_b8 = 0xaaaaaaaaaaaaaaaa;
  iVar6 = QRect::x((QRect *)0x16b02e);
  iVar6 = iVar6 + iVar3;
  iVar7 = QRect::y((QRect *)0x16b046);
  iVar7 = iVar7 + iVar4;
  iVar4 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  iVar4 = iVar4 - (iVar3 + iVar5 + 1);
  QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
               in_stack_fffffffffffffe48);
  local_c8 = 0xaaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_c8,(QPaintDevice *)(in_RDI + 1));
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QWidget::palette();
  QPalette::mid((QPalette *)0x16b101);
  pQVar9 = QBrush::color((QBrush *)0x16b109);
  local_18 = *(undefined8 *)pQVar9;
  local_10 = *(undefined8 *)((long)&pQVar9->ct + 4);
  for (local_144 = 1; local_144 < 6; local_144 = local_144 + 1) {
    QColor::setAlpha((int)&local_18);
    local_d8.x2.m_i = -0x55555556;
    local_d8.y2.m_i = -0x55555556;
    local_d8.x1.m_i = -0x55555556;
    local_d8.y1.m_i = -0x55555556;
    local_d8 = QRect::adjusted(in_RDI,iVar4,iVar7,iVar6,in_stack_fffffffffffffe78);
    QPainter::setPen((QColor *)&local_c8);
    in_stack_fffffffffffffe4c = QRect::left((QRect *)0x16b1ba);
    in_stack_fffffffffffffe50 = QRect::bottom((QRect *)0x16b1cb);
    in_stack_fffffffffffffe54 = QRect::right((QRect *)0x16b1dc);
    QRect::bottom((QRect *)0x16b1ed);
    QPainter::drawLine(this_00,iVar2,in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                       in_stack_fffffffffffffe58);
    in_stack_fffffffffffffe58 = QRect::right((QRect *)0x16b216);
    in_stack_fffffffffffffe5c = QRect::top((QRect *)0x16b227);
    in_stack_fffffffffffffe60 = QRect::right((QRect *)0x16b238);
    QRect::bottom((QRect *)0x16b249);
    QPainter::drawLine(this_00,iVar2,in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                       in_stack_fffffffffffffe58);
  }
  QWidget::palette();
  QPalette::light((QPalette *)0x16b28b);
  QPainter::fillRect((QRect *)&local_c8,(QBrush *)&local_68);
  bVar1 = QRect::isValid((QRect *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  if (bVar1) {
    QWidget::palette();
    pQVar9 = QPalette::color((QPalette *)
                             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                             in_stack_fffffffffffffe4c);
    QBrush::QBrush(local_e8,(QColor *)pQVar9,SolidPattern);
    QPen::QPen((QPen *)0x0,local_e0,local_e8,3,0x10,0x40);
    QPainter::setPen((QPen *)&local_c8);
    QPen::~QPen(local_e0);
    QBrush::~QBrush(local_e8);
    QPainter::drawRect((QPainter *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       (QRect *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    QRect::adjust((QRect *)CONCAT44(iVar2,in_stack_fffffffffffffe60),in_stack_fffffffffffffe5c,
                  in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,in_stack_fffffffffffffe50);
    QPainter::setClipRect((QRect *)&local_c8,(ClipOperation)&local_c0);
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    QFont::QFont((QFont *)&local_28);
    dVar10 = (double)QFont::pointSizeF();
    QFont::setPointSizeF(dVar10 * 0.25);
    QPainter::setFont((QFont *)&local_c8);
    QWidget::palette();
    QPalette::color((QPalette *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                    in_stack_fffffffffffffe4c);
    QPainter::setPen((QColor *)&local_c8);
    local_100 = 0xaaaaaaaaaaaaaaaa;
    local_f8 = 0xaaaaaaaaaaaaaaaa;
    local_f0 = 0xaaaaaaaaaaaaaaaa;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    latin1.m_size._4_4_ = iVar4;
    latin1.m_size._0_4_ = iVar7;
    latin1.m_data = (char *)in_RDI;
    QString::QString((QString *)CONCAT44(iVar2,in_stack_fffffffffffffe60),latin1);
    for (local_15c = 0; local_15c < 3; local_15c = local_15c + 1) {
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                          (QString *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    }
    iVar4 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    iVar5 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    iVar2 = in_RDI[3].x1.m_i;
    iVar3 = in_RDI[3].x1.m_i;
    QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    for (local_16c = 0; local_16c < in_RDI[3].x1.m_i; local_16c = local_16c + 1) {
      for (local_170 = 0; local_170 < in_RDI[3].y1.m_i; local_170 = local_170 + 1) {
        local_110 = 0xaaaaaaaaaaaaaaaa;
        local_108 = 0xaaaaaaaaaaaaaaaa;
        iVar6 = QRect::left((QRect *)0x16b576);
        iVar6 = iVar6 + local_16c *
                        ((iVar5 - (int)((double)iVar4 * 0.1) * (iVar2 + -1)) / iVar3 +
                        (int)((double)iVar4 * 0.1));
        QRect::top((QRect *)0x16b597);
        QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                     in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                     iVar6);
        uVar8 = Qt::operator|(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50);
        QPainter::drawText((QRect *)&local_c8,(int)&local_110,(QString *)(ulong)uVar8,
                           (QRect *)&local_100);
      }
    }
    QString::~QString((QString *)0x16b625);
    QFont::~QFont((QFont *)&local_28);
  }
  QPainter::~QPainter((QPainter *)&local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void paintEvent(QPaintEvent *) override
    {
        QSize pageSize = m_pageLayout.fullRectPoints().size();
        QSizeF scaledSize = pageSize.scaled(width() - 10, height() - 10, Qt::KeepAspectRatio);
        QRect pageRect = QRect(QPoint(0,0), scaledSize.toSize());
        pageRect.moveCenter(rect().center());
        qreal width_factor = scaledSize.width() / pageSize.width();
        qreal height_factor = scaledSize.height() / pageSize.height();
        QMarginsF margins = m_pageLayout.margins(QPageLayout::Point);
        int left = qRound(margins.left() * width_factor);
        int top = qRound(margins.top() * height_factor);
        int right = qRound(margins.right() * width_factor);
        int bottom = qRound(margins.bottom() * height_factor);
        QRect marginRect(pageRect.x() + left, pageRect.y() + top,
                         pageRect.width() - (left + right + 1), pageRect.height() - (top + bottom + 1));

        QPainter p(this);
        QColor shadow(palette().mid().color());
        for (int i=1; i<6; ++i) {
            shadow.setAlpha(180-i*30);
            QRect offset(pageRect.adjusted(i, i, i, i));
            p.setPen(shadow);
            p.drawLine(offset.left(), offset.bottom(), offset.right(), offset.bottom());
            p.drawLine(offset.right(), offset.top(), offset.right(), offset.bottom()-1);
        }
        p.fillRect(pageRect, palette().light());

        if (marginRect.isValid()) {
            p.setPen(QPen(palette().color(QPalette::Dark), 0, Qt::DotLine));
            p.drawRect(marginRect);

            marginRect.adjust(2, 2, -1, -1);
            p.setClipRect(marginRect);
            QFont font;
            font.setPointSizeF(font.pointSizeF()*0.25);
            p.setFont(font);
            p.setPen(palette().color(QPalette::Dark));
            QString text("Lorem ipsum dolor sit amet, consectetuer adipiscing elit, sed diam nonummy nibh euismod tincidunt ut laoreet dolore magna aliquam erat volutpat. Ut wisi enim ad minim veniam, quis nostrud exerci tation ullamcorper suscipit lobortis nisl ut aliquip ex ea commodo consequat. Duis autem vel eum iriure dolor in hendrerit in vulputate velit esse molestie consequat, vel illum dolore eu feugiat nulla facilisis at vero eros et accumsan et iusto odio dignissim qui blandit praesent luptatum zzril delenit augue duis dolore te feugait nulla facilisi."_L1);
            for (int i=0; i<3; ++i)
                text += text;

            const int spacing = pageRect.width() * 0.1;
            const int textWidth = (marginRect.width() - (spacing * (m_pagePreviewColumns-1))) / m_pagePreviewColumns;
            const int textHeight = (marginRect.height() - (spacing * (m_pagePreviewRows-1))) / m_pagePreviewRows;

            for (int x = 0 ; x < m_pagePreviewColumns; ++x) {
                for (int y = 0 ; y < m_pagePreviewRows; ++y) {
                    QRect textRect(marginRect.left() + x * (textWidth + spacing),
                                   marginRect.top() + y * (textHeight + spacing),
                                   textWidth, textHeight);
                    p.drawText(textRect, Qt::TextWordWrap|Qt::AlignVCenter, text);
                }
            }
        }
    }